

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O2

void NULLCDynamic::Override(NULLCRef dest,NULLCArray code)

{
  FastVector<ExternMemberInfo,_false,_false> *this;
  uint uVar1;
  nullres nVar2;
  int iVar3;
  ExternTypeInfo *pEVar4;
  ExternMemberInfo *pEVar5;
  char *pcVar6;
  char *pcVar7;
  size_t size;
  ulong uVar8;
  char *pcVar9;
  char *bytecode;
  char tmp [2048];
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                  ,0x25,"void NULLCDynamic::Override(NULLCRef, NULLCArray)");
  }
  pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
  if (pEVar4->subCat == CAT_FUNCTION) {
    this = (FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210);
    pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
    pEVar5 = FastVector<ExternMemberInfo,_false,_false>::operator[](this,(pEVar4->field_11).subType)
    ;
    pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),pEVar5->type);
    pcVar6 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),0);
    iVar3 = NULLC::SafeSprintf(tmp,0x800,"import __last;\r\n%s __override%d(",
                               pcVar6 + pEVar4->offsetToName,(ulong)Override::overrideID);
    pcVar6 = tmp + iVar3;
    pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),dest.typeID);
    uVar1 = (pEVar4->field_8).arrSize;
    uVar8 = 0;
    while (size = (size_t)(((int)tmp - (int)pcVar6) + 0x800), uVar1 != uVar8) {
      pcVar7 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),0);
      pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                          pEVar5[uVar8 + 1 & 0xffffffff].type);
      pcVar9 = ", ";
      if (uVar1 - 1 == uVar8) {
        pcVar9 = "";
      }
      iVar3 = NULLC::SafeSprintf(pcVar6,size,"%s arg%d%s",pcVar7 + pEVar4->offsetToName,
                                 uVar8 & 0xffffffff,pcVar9);
      pcVar6 = pcVar6 + iVar3;
      uVar8 = uVar8 + 1;
    }
    NULLC::SafeSprintf(pcVar6,size,"){ %s }",code.ptr);
    Override::overrideID = Override::overrideID + 1;
    nVar2 = nullcCompile(tmp);
    if (nVar2 != '\0') {
      bytecode = (char *)0x0;
      nullcGetBytecodeNoCache(&bytecode);
      nVar2 = nullcLinkCode(bytecode);
      if (nVar2 != '\0') {
        if (bytecode != (char *)0x0) {
          operator_delete__(bytecode);
        }
        nullcRedirectFunction(*(uint *)(dest.ptr + 8),*(int *)(linker + 0x24c) - 1);
        return;
      }
      if (bytecode != (char *)0x0) {
        operator_delete__(bytecode);
      }
    }
    pcVar6 = nullcGetLastError();
    nullcThrowError("%s",pcVar6);
    return;
  }
  nullcThrowError("Destination variable is not a function");
  return;
}

Assistant:

void Override(NULLCRef dest, NULLCArray code)
	{
		assert(linker);
		static unsigned int overrideID = 0;

		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}

		char tmp[2048];
		char *it = tmp;
		ExternMemberInfo *memberList = &linker->exTypeExtra[linker->exTypes[dest.typeID].memberOffset];
		ExternTypeInfo &returnType = linker->exTypes[memberList[0].type];
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "import __last;\r\n%s __override%d(", &linker->exSymbols[0] + returnType.offsetToName, overrideID);

		for(unsigned int i = 0, memberCount = linker->exTypes[dest.typeID].memberCount; i != memberCount; i++)
			it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "%s arg%d%s", &linker->exSymbols[0] + linker->exTypes[memberList[i + 1].type].offsetToName, i, i == memberCount - 1 ? "" : ", ");
		it += NULLC::SafeSprintf(it, 2048 - int(it - tmp), "){ %s }", code.ptr);
		overrideID++;

		if(!nullcCompile(tmp))
		{
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		char *bytecode = NULL;
		nullcGetBytecodeNoCache(&bytecode);
		if(!nullcLinkCode(bytecode))
		{
			delete[] bytecode;
			nullcThrowError("%s", nullcGetLastError());
			return;
		}
		delete[] bytecode;

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, linker->exFunctions.size() - 1);
	}